

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyRwr.c
# Opt level: O0

Ivy_Obj_t * Ivy_GraphToNetwork(Ivy_Man_t *p,Dec_Graph_t *pGraph)

{
  int iVar1;
  Ivy_Obj_t *pIVar2;
  Dec_Node_t *pDVar3;
  Ivy_Obj_t *p1;
  int local_3c;
  Dec_Node_t *pDStack_38;
  int i;
  Dec_Node_t *pNode;
  Ivy_Obj_t *pAnd1;
  Ivy_Obj_t *pAnd0;
  Dec_Graph_t *pGraph_local;
  Ivy_Man_t *p_local;
  
  pDStack_38 = (Dec_Node_t *)0x0;
  iVar1 = Dec_GraphIsConst(pGraph);
  if (iVar1 == 0) {
    iVar1 = Dec_GraphIsVar(pGraph);
    if (iVar1 == 0) {
      for (local_3c = pGraph->nLeaves; local_3c < pGraph->nSize; local_3c = local_3c + 1) {
        pDStack_38 = Dec_GraphNode(pGraph,local_3c);
        pDVar3 = Dec_GraphNode(pGraph,(uint)pDStack_38->eEdge0 >> 1 & 0x3fffffff);
        pIVar2 = Ivy_NotCond((Ivy_Obj_t *)(pDVar3->field_2).pFunc,(uint)pDStack_38->eEdge0 & 1);
        pDVar3 = Dec_GraphNode(pGraph,(uint)pDStack_38->eEdge1 >> 1 & 0x3fffffff);
        p1 = Ivy_NotCond((Ivy_Obj_t *)(pDVar3->field_2).pFunc,(uint)pDStack_38->eEdge1 & 1);
        pIVar2 = Ivy_And(p,pIVar2,p1);
        (pDStack_38->field_2).pFunc = pIVar2;
      }
      pIVar2 = (Ivy_Obj_t *)(pDStack_38->field_2).pFunc;
      iVar1 = Dec_GraphIsComplement(pGraph);
      p_local = (Ivy_Man_t *)Ivy_NotCond(pIVar2,iVar1);
    }
    else {
      pDVar3 = Dec_GraphVar(pGraph);
      pIVar2 = (Ivy_Obj_t *)(pDVar3->field_2).pFunc;
      iVar1 = Dec_GraphIsComplement(pGraph);
      p_local = (Ivy_Man_t *)Ivy_NotCond(pIVar2,iVar1);
    }
  }
  else {
    pIVar2 = Ivy_ManConst1(p);
    iVar1 = Dec_GraphIsComplement(pGraph);
    p_local = (Ivy_Man_t *)Ivy_NotCond(pIVar2,iVar1);
  }
  return (Ivy_Obj_t *)p_local;
}

Assistant:

Ivy_Obj_t * Ivy_GraphToNetwork( Ivy_Man_t * p, Dec_Graph_t * pGraph )
{
    Ivy_Obj_t * pAnd0, * pAnd1;
    Dec_Node_t * pNode = NULL; // Suppress "might be used uninitialized"
    int i;
    // check for constant function
    if ( Dec_GraphIsConst(pGraph) )
        return Ivy_NotCond( Ivy_ManConst1(p), Dec_GraphIsComplement(pGraph) );
    // check for a literal
    if ( Dec_GraphIsVar(pGraph) )
        return Ivy_NotCond( (Ivy_Obj_t *)Dec_GraphVar(pGraph)->pFunc, Dec_GraphIsComplement(pGraph) );
    // build the AIG nodes corresponding to the AND gates of the graph
    Dec_GraphForEachNode( pGraph, pNode, i )
    {
        pAnd0 = Ivy_NotCond( (Ivy_Obj_t *)Dec_GraphNode(pGraph, pNode->eEdge0.Node)->pFunc, pNode->eEdge0.fCompl ); 
        pAnd1 = Ivy_NotCond( (Ivy_Obj_t *)Dec_GraphNode(pGraph, pNode->eEdge1.Node)->pFunc, pNode->eEdge1.fCompl ); 
        pNode->pFunc = Ivy_And( p, pAnd0, pAnd1 );
    }
    // complement the result if necessary
    return Ivy_NotCond( (Ivy_Obj_t *)pNode->pFunc, Dec_GraphIsComplement(pGraph) );
}